

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EventControlWithExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventControlWithExpressionSyntax,slang::parsing::Token,slang::syntax::EventExpressionSyntax&>
          (BumpAllocator *this,Token *args,EventExpressionSyntax *args_1)

{
  Token at;
  EventControlWithExpressionSyntax *pEVar1;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pEVar1 = (EventControlWithExpressionSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  at.info = in_RSI;
  at._0_8_ = in_RDX;
  slang::syntax::EventControlWithExpressionSyntax::EventControlWithExpressionSyntax
            ((EventControlWithExpressionSyntax *)in_RSI->location,at,
             (EventExpressionSyntax *)in_RSI->rawTextPtr);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }